

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void enqueue(debug_level level,string *tag,string *string)

{
  log_queue *this;
  log_entry *this_00;
  unique_lock<std::recursive_mutex> lock;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&lock,&mutex);
  this = queue;
  if (queue != (log_queue *)0x0) {
    this_00 = (log_entry *)operator_new(0x48);
    log_queue::log_entry::log_entry(this_00,level,tag,string);
    log_queue::push(this,this_00);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  return;
}

Assistant:

static void enqueue(debug_level level, const std::string& tag, const std::string& string) {
    std::unique_lock<std::recursive_mutex> lock(mutex);

    if (queue) {
        queue->push(new log_queue::log_entry(level, tag, string));
    }
}